

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo.c
# Opt level: O2

int complt(int flags,int c,char *buf,size_t nbuf,int cpos,int *nx)

{
  char c_00;
  int iVar1;
  int iVar2;
  size_t sVar3;
  buffer *lp1;
  char *pcVar4;
  int iVar5;
  int iVar6;
  ulong __n;
  int iVar7;
  buffer *lp2;
  buffer *local_48;
  int local_3c;
  int local_34;
  
  __n = (ulong)cpos;
  if ((flags & 1U) == 0) {
    if ((flags & 2U) == 0) {
      if ((flags & 4U) == 0) {
        panic("broken complt call: flags");
      }
      buf[cpos] = '\0';
      lp1 = (buffer *)make_file_list(buf);
      local_48 = lp1;
    }
    else {
      local_48 = (buffer *)0x0;
      lp1 = bheadp;
    }
  }
  else {
    buf[__n] = '\0';
    lp1 = (buffer *)complete_function_list(buf);
    local_48 = lp1;
  }
  if ((c & 0xfffffffbU) == 9) {
    lp2 = (buffer *)0x0;
    local_34 = 1000;
    local_3c = 0;
    for (; lp1 != (buffer *)0x0; lp1 = (buffer *)(lp1->b_list).l_p.l_wp) {
      pcVar4 = (lp1->b_list).l_name;
      iVar2 = bcmp(buf,pcVar4,__n);
      if (iVar2 == 0) {
        if (local_3c == 0) {
          lp2 = lp1;
        }
        local_3c = local_3c + 1;
        if (pcVar4[__n] == '\0') {
          local_34 = -1;
        }
        else {
          iVar2 = getxtra(&lp1->b_list,&lp2->b_list,cpos,0);
          lp2 = lp1;
          if (iVar2 < local_34) {
            local_34 = iVar2;
          }
        }
      }
    }
    if (local_3c == 0) {
      pcVar4 = " [No match]";
    }
    else {
      if ((local_3c < 2) || (local_34 != 0)) {
        iVar2 = 0;
        for (; (iVar2 < local_34 && (__n < nbuf)); __n = __n + 1) {
          c_00 = (lp2->b_list).l_name[__n];
          buf[__n] = c_00;
          eputc(c_00);
          iVar2 = iVar2 + 1;
        }
        ttflush();
        free_file_list(&local_48->b_list);
        iVar2 = 0;
        if (0 < local_34) {
          iVar2 = local_34;
        }
        if (c == 0xd) {
          iVar2 = local_34;
        }
        *nx = iVar2;
        return 1;
      }
      pcVar4 = " [Ambiguous. Ctrl-G to cancel]";
    }
    free_file_list(&local_48->b_list);
    sVar3 = strlen(pcVar4);
    iVar1 = ncol;
    iVar2 = ttcol;
    iVar7 = (int)sVar3 + ttcol + 2;
    iVar6 = (ncol - ttcol) + -2;
    if (iVar7 <= ncol) {
      iVar6 = (int)sVar3;
    }
    eputs(pcVar4);
    ttcol = ttcol - iVar6;
    iVar5 = iVar7;
    if (iVar1 < iVar7) {
      iVar5 = iVar1;
    }
    for (iVar5 = (iVar2 - iVar5) + 2; iVar5 != 0; iVar5 = iVar5 + 1) {
      ttputc(8);
    }
    ttflush();
    iVar5 = iVar7;
    if (iVar1 < iVar7) {
      iVar5 = iVar1;
    }
    for (iVar5 = (iVar2 - iVar5) + 2; iVar5 != 0; iVar5 = iVar5 + 1) {
      eputc(' ');
    }
    ttcol = ttcol - iVar6;
    if (iVar1 < iVar7) {
      iVar7 = iVar1;
    }
    for (iVar2 = (iVar2 - iVar7) + 2; iVar2 != 0; iVar2 = iVar2 + 1) {
      ttputc(8);
    }
    *nx = local_34;
    return (uint)(0 < local_3c);
  }
  panic("broken complt call: c");
}

Assistant:

static int
complt(int flags, int c, char *buf, size_t nbuf, int cpos, int *nx)
{
	struct list	*lh, *lh2;
	struct list	*wholelist = NULL;
	int	 i, nxtra, nhits, bxtra, msglen, nshown;
	int	 wflag = FALSE;
	char	*msg;

	lh = lh2 = NULL;

	if ((flags & EFFUNC) != 0) {
		buf[cpos] = '\0';
		wholelist = lh = complete_function_list(buf);
	} else if ((flags & EFBUF) != 0) {
		lh = &(bheadp->b_list);
	} else if ((flags & EFFILE) != 0) {
		buf[cpos] = '\0';
		wholelist = lh = make_file_list(buf);
	} else
		panic("broken complt call: flags");

	if (c == ' ')
		wflag = TRUE;
	else if (c != '\t' && c != CCHR('M'))
		panic("broken complt call: c");

	nhits = 0;
	nxtra = HUGE;

	for (; lh != NULL; lh = lh->l_next) {
		if (memcmp(buf, lh->l_name, cpos) != 0)
			continue;
		if (nhits == 0)
			lh2 = lh;
		++nhits;
		if (lh->l_name[cpos] == '\0')
			nxtra = -1; /* exact match */
		else {
			bxtra = getxtra(lh, lh2, cpos, wflag);
			if (bxtra < nxtra)
				nxtra = bxtra;
			lh2 = lh;
		}
	}
	if (nhits == 0)
		msg = " [No match]";
	else if (nhits > 1 && nxtra == 0)
		msg = " [Ambiguous. Ctrl-G to cancel]";
	else {
		/*
		 * Being lazy - ought to check length, but all things
		 * autocompleted have known types/lengths.
		 */
		if (nxtra < 0 && nhits > 1 && c == ' ')
			nxtra = 1; /* ??? */
		for (i = 0; i < nxtra && cpos < nbuf; ++i) {
			buf[cpos] = lh2->l_name[cpos];
			eputc(buf[cpos++]);
		}
		/* XXX should grow nbuf */
		ttflush();
		free_file_list(wholelist);
		*nx = nxtra;
		if (nxtra < 0 && c != CCHR('M')) /* exact */
			*nx = 0;
		return (TRUE);
	}

	/*
	 * wholelist is NULL if we are doing buffers.  Want to free lists
	 * that were created for us, but not the buffer list!
	 */
	free_file_list(wholelist);

	/* Set up backspaces, etc., being mindful of echo line limit. */
	msglen = strlen(msg);
	nshown = (ttcol + msglen + 2 > ncol) ?
		ncol - ttcol - 2 : msglen;
	eputs(msg);
	ttcol -= (i = nshown);	/* update ttcol!		 */
	while (i--)		/* move back before msg		 */
		ttputc('\b');
	ttflush();		/* display to user		 */
	i = nshown;
	while (i--)		/* blank out on next flush	 */
		eputc(' ');
	ttcol -= (i = nshown);	/* update ttcol on BS's		 */
	while (i--)
		ttputc('\b');	/* update ttcol again!		 */
	*nx = nxtra;
	return ((nhits > 0) ? TRUE : FALSE);
}